

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O0

const_iterator __thiscall
VarnodeBank::beginLoc(VarnodeBank *this,int4 s,Address *addr,Address *pc,uintm uniq)

{
  pointer *this_00;
  key_type local_c8;
  _Base_ptr local_c0;
  undefined1 local_b8 [8];
  PcodeOp searchop;
  SeqNum sq;
  uintm uniq_local;
  Address *pc_local;
  Address *addr_local;
  int4 s_local;
  VarnodeBank *this_local;
  const_iterator iter;
  
  std::_Rb_tree_const_iterator<Varnode_*>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<Varnode_*> *)&this_local);
  (this->searchvn).size = s;
  Address::operator=(&(this->searchvn).loc,addr);
  (this->searchvn).flags = 0x10;
  sq.order = uniq;
  if (uniq == 0xffffffff) {
    sq.order = 0;
  }
  this_00 = &searchop.inrefs.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  SeqNum::SeqNum((SeqNum *)this_00,pc,sq.order);
  PcodeOp::PcodeOp((PcodeOp *)local_b8,0,(SeqNum *)this_00);
  local_c8 = &this->searchvn;
  (this->searchvn).def = (PcodeOp *)local_b8;
  local_c0 = (_Base_ptr)
             std::set<Varnode_*,_VarnodeCompareLocDef,_std::allocator<Varnode_*>_>::lower_bound
                       (&this->loc_tree,&local_c8);
  (this->searchvn).size = 0;
  (this->searchvn).flags = 8;
  this_local = (VarnodeBank *)local_c0;
  PcodeOp::~PcodeOp((PcodeOp *)local_b8);
  return (const_iterator)(_Base_ptr)this_local;
}

Assistant:

VarnodeLocSet::const_iterator VarnodeBank::beginLoc(int4 s,const Address &addr,
						    const Address &pc,uintm uniq) const

{				// Find first varnode of given loc and size
				// defined at a particular location
  VarnodeLocSet::const_iterator iter;
  searchvn.size = s;
  searchvn.loc = addr;
  searchvn.flags = Varnode::written;
  if (uniq==~((uintm)0))	// If don't care about uniq
    uniq = 0;			// find earliest
  SeqNum sq(pc,uniq);
  PcodeOp searchop(0,sq);
  searchvn.def = &searchop;
  iter = loc_tree.lower_bound(&searchvn);

  searchvn.size = 0;
  searchvn.flags = Varnode::input;
  return iter;
}